

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

int __thiscall QTemporaryFileEngine::rename(QTemporaryFileEngine *this,char *__old,char *__new)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__new_00;
  char *pcVar4;
  MaterializationMode in_stack_0000000c;
  bool ok;
  QString *in_stack_00000010;
  QTemporaryFileEngine *in_stack_00000018;
  undefined1 local_1;
  
  pcVar4 = __old;
  bVar1 = isUnnamedFile(this);
  if (bVar1) {
    iVar2 = (int)__old;
    local_1 = materializeUnnamedFile(in_stack_00000018,in_stack_00000010,in_stack_0000000c);
    iVar2 = QFSFileEngine::close(&this->super_QFSFileEngine,iVar2);
    uVar3 = CONCAT31((int3)((uint)iVar2 >> 8),local_1);
  }
  else {
    QFSFileEngine::close(&this->super_QFSFileEngine,(int)pcVar4);
    uVar3 = QFSFileEngine::rename(&this->super_QFSFileEngine,__old,__new_00);
    uVar3 = uVar3 & 0xffffff01;
    local_1 = SUB41(uVar3,0);
  }
  return CONCAT31((int3)(uVar3 >> 8),local_1);
}

Assistant:

bool QTemporaryFileEngine::rename(const QString &newName)
{
    if (isUnnamedFile()) {
        bool ok = materializeUnnamedFile(newName, DontOverwrite);
        QFSFileEngine::close();
        return ok;
    }
    QFSFileEngine::close();
    return QFSFileEngine::rename(newName);
}